

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

csubstr __thiscall c4::yml::Parser::_scan_dquot_scalar(Parser *this)

{
  ulong uVar1;
  code *pcVar2;
  Location LVar3;
  Location LVar4;
  Location LVar5;
  Location LVar6;
  Location LVar7;
  Location LVar8;
  Location LVar9;
  Location LVar10;
  Location LVar11;
  bool bVar12;
  uint uVar13;
  bool bVar14;
  char cVar15;
  bool bVar16;
  ulong uVar17;
  State *pSVar18;
  long lVar19;
  char *pcVar20;
  size_t sVar21;
  basic_substring<char> *pbVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  byte bVar27;
  csubstr cVar28;
  basic_substring<char> bVar29;
  char msg [41];
  basic_substring<char> local_1e8;
  basic_substring<char> local_1d8;
  char local_1c8 [48];
  undefined4 local_198;
  undefined1 local_194;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  char *pcStack_178;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  char *pcStack_150;
  undefined8 local_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  char *pcStack_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  char *pcStack_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  char *pcStack_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  char *pcStack_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  char *pcStack_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  char *pcStack_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  char *pcStack_38;
  undefined8 local_30;
  
  bVar27 = 0;
  uVar17 = (this->m_state->pos).super_LineCol.offset;
  uVar23 = (this->m_buf).len;
  if (uVar23 < uVar17) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
      pcVar2 = (code *)swi(3);
      cVar28 = (csubstr)(*pcVar2)();
      return cVar28;
    }
    handle_error(0x1fa937,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x1533,"first >= 0 && first <= len");
  }
  basic_substring<char>::basic_substring(&local_1d8,(this->m_buf).str + uVar17,uVar23 - uVar17);
  local_1e8 = local_1d8;
  if (local_1d8.len == 0) {
    sVar21 = (this->m_state->pos).super_LineCol.offset;
  }
  else {
    cVar15 = *local_1d8.str;
    if (cVar15 == ' ') {
      local_1e8 = basic_substring<char>::triml(&local_1e8,' ');
      uVar23 = (this->m_buf).len;
      if (uVar23 < uVar17) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
          pcVar2 = (code *)swi(3);
          cVar28 = (csubstr)(*pcVar2)();
          return cVar28;
        }
        handle_error(0x1fa937,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x1533,"first >= 0 && first <= len");
      }
      basic_substring<char>::basic_substring(&local_1d8,(this->m_buf).str + uVar17,uVar23 - uVar17);
      if (local_1d8.len == 0) {
        if ((local_1e8.len != 0) ||
           (pcVar20 = local_1d8.str, local_1d8.str == (char *)0x0 || local_1d8.str != local_1e8.str)
           ) goto LAB_001dd3a1;
      }
      else {
        pcVar20 = local_1e8.str;
        if (local_1e8.str < local_1d8.str ||
            local_1d8.str + local_1d8.len < local_1e8.str + local_1e8.len) {
LAB_001dd3a1:
          builtin_strncpy(local_1c8,"_buf.sub(b).is_super(s))",0x19);
          local_1d8.len._0_1_ = 'i';
          local_1d8.len._1_1_ = 'l';
          local_1d8.len._2_1_ = 'e';
          local_1d8.len._3_1_ = 'd';
          local_1d8.len._4_1_ = ':';
          local_1d8.len._5_1_ = ' ';
          local_1d8.len._6_1_ = '(';
          local_1d8.len._7_1_ = 'm';
          local_1d8.str = (char *)0x6166206b63656863;
          if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
            pcVar2 = (code *)swi(3);
            cVar28 = (csubstr)(*pcVar2)();
            return cVar28;
          }
          local_50 = 0;
          uStack_48 = 0x7a7c;
          local_40 = 0;
          pcStack_38 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_30 = 0x65;
          LVar3.super_LineCol.col = 0;
          LVar3.super_LineCol.offset = SUB168(ZEXT816(0x7a7c) << 0x40,0);
          LVar3.super_LineCol.line = SUB168(ZEXT816(0x7a7c) << 0x40,8);
          LVar3.name.str =
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          LVar3.name.len = 0x65;
          (*(this->m_stack).m_callbacks.m_error)
                    ((char *)&local_1d8,0x29,LVar3,(this->m_stack).m_callbacks.m_user_data);
          pcVar20 = local_1e8.str;
        }
      }
      uVar23 = (this->m_buf).len;
      if (uVar23 < uVar17) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
          pcVar2 = (code *)swi(3);
          cVar28 = (csubstr)(*pcVar2)();
          return cVar28;
        }
        handle_error(0x1fa937,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x1533,"first >= 0 && first <= len");
      }
      basic_substring<char>::basic_substring(&local_1d8,(this->m_buf).str + uVar17,uVar23 - uVar17);
      if (pcVar20 < local_1d8.str) {
        builtin_strncpy(local_1c8,".begin() >= m_buf.sub(b).begin())",0x22);
        local_1d8.len._0_1_ = 'i';
        local_1d8.len._1_1_ = 'l';
        local_1d8.len._2_1_ = 'e';
        local_1d8.len._3_1_ = 'd';
        local_1d8.len._4_1_ = ':';
        local_1d8.len._5_1_ = ' ';
        local_1d8.len._6_1_ = '(';
        local_1d8.len._7_1_ = 's';
        local_1d8.str = (char *)0x6166206b63656863;
        if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
          pcVar2 = (code *)swi(3);
          cVar28 = (csubstr)(*pcVar2)();
          return cVar28;
        }
        local_78 = 0;
        uStack_70 = 0x7a7d;
        local_68 = 0;
        pcStack_60 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_58 = 0x65;
        LVar4.super_LineCol.col = 0;
        LVar4.super_LineCol.offset = SUB168(ZEXT816(0x7a7d) << 0x40,0);
        LVar4.super_LineCol.line = SUB168(ZEXT816(0x7a7d) << 0x40,8);
        LVar4.name.str =
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        LVar4.name.len = 0x65;
        (*(this->m_stack).m_callbacks.m_error)
                  ((char *)&local_1d8,0x32,LVar4,(this->m_stack).m_callbacks.m_user_data);
      }
      pcVar20 = local_1e8.str;
      uVar23 = (this->m_buf).len;
      if (uVar23 < uVar17) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
          pcVar2 = (code *)swi(3);
          cVar28 = (csubstr)(*pcVar2)();
          return cVar28;
        }
        handle_error(0x1fa937,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x1533,"first >= 0 && first <= len");
      }
      basic_substring<char>::basic_substring(&local_1d8,(this->m_buf).str + uVar17,uVar23 - uVar17);
      _line_progressed(this,(long)pcVar20 - (long)local_1d8.str);
      sVar21 = (this->m_state->pos).super_LineCol.offset;
      if (local_1e8.len == 0) goto LAB_001dd5ab;
      cVar15 = *local_1e8.str;
    }
    else {
      sVar21 = (this->m_state->pos).super_LineCol.offset;
    }
    if (cVar15 == '\"') goto LAB_001dd657;
  }
LAB_001dd5ab:
  builtin_strncpy(local_1c8,".begins_with(\'\"\'))",0x13);
  local_1d8.len._0_1_ = 'i';
  local_1d8.len._1_1_ = 'l';
  local_1d8.len._2_1_ = 'e';
  local_1d8.len._3_1_ = 'd';
  local_1d8.len._4_1_ = ':';
  local_1d8.len._5_1_ = ' ';
  local_1d8.len._6_1_ = '(';
  local_1d8.len._7_1_ = 's';
  local_1d8.str = (char *)0x6166206b63656863;
  if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
    pcVar2 = (code *)swi(3);
    cVar28 = (csubstr)(*pcVar2)();
    return cVar28;
  }
  local_a0 = 0;
  uStack_98 = 0x7a81;
  local_90 = 0;
  pcStack_88 = 
  "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
  ;
  local_80 = 0x65;
  LVar5.super_LineCol.col = 0;
  LVar5.super_LineCol.offset = SUB168(ZEXT816(0x7a81) << 0x40,0);
  LVar5.super_LineCol.line = SUB168(ZEXT816(0x7a81) << 0x40,8);
  LVar5.name.str =
       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
  ;
  LVar5.name.len = 0x65;
  (*(this->m_stack).m_callbacks.m_error)
            ((char *)&local_1d8,0x23,LVar5,(this->m_stack).m_callbacks.m_user_data);
LAB_001dd657:
  _line_progressed(this,1);
  if (local_1e8.len == 0) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
      pcVar2 = (code *)swi(3);
      cVar28 = (csubstr)(*pcVar2)();
      return cVar28;
    }
    handle_error(0x1fa937,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x1533,"first >= 0 && first <= len");
  }
  basic_substring<char>::basic_substring(&local_1d8,local_1e8.str + 1,local_1e8.len - 1);
  local_1e8 = local_1d8;
  pSVar18 = this->m_state;
  uVar17 = (this->m_buf).len;
  if ((pSVar18->pos).super_LineCol.offset < uVar17) {
    uVar23 = 1;
    bVar14 = false;
    do {
      uVar25 = (pSVar18->line_contents).rem.len;
      if (uVar25 == 0) {
        bVar14 = true;
      }
      else {
        pcVar20 = (pSVar18->line_contents).rem.str;
        bVar16 = true;
        uVar24 = 0;
        do {
          cVar15 = pcVar20[uVar24];
          bVar16 = (bool)(cVar15 == ' ' & bVar16);
          if (cVar15 == '\\') {
            uVar1 = uVar24 + 1;
            bVar14 = true;
            if ((uVar1 < uVar25) && ((pcVar20[uVar1] == '\\' || (pcVar20[uVar1] == '\"')))) {
              uVar24 = uVar1;
            }
          }
          else if (cVar15 == '\"') goto LAB_001dd719;
          uVar24 = uVar24 + 1;
        } while (uVar24 < uVar25);
        uVar24 = 0xffffffffffffffff;
LAB_001dd719:
        bVar12 = !bVar14;
        bVar14 = true;
        if ((uVar23 < 2 && bVar12) && !bVar16) {
          bVar14 = false;
          if ((uVar25 != 0) && (bVar14 = false, pcVar20 == (pSVar18->line_contents).full.str)) {
            bVar14 = *pcVar20 == ' ';
          }
        }
        if (uVar24 != 0xffffffffffffffff) {
          if (uVar17 <= uVar24) {
            builtin_strncpy(local_1c8,"os >= 0 && pos < m_buf.len)",0x1c);
            local_1d8.len._0_1_ = 'i';
            local_1d8.len._1_1_ = 'l';
            local_1d8.len._2_1_ = 'e';
            local_1d8.len._3_1_ = 'd';
            local_1d8.len._4_1_ = ':';
            local_1d8.len._5_1_ = ' ';
            local_1d8.len._6_1_ = '(';
            local_1d8.len._7_1_ = 'p';
            local_1d8.str = (char *)0x6166206b63656863;
            if ((((byte)s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
              pcVar2 = (code *)swi(3);
              cVar28 = (csubstr)(*pcVar2)();
              return cVar28;
            }
            local_c8 = 0;
            uStack_c0 = 0x7ab1;
            local_b8 = 0;
            pcStack_b0 = 
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            local_a8 = 0x65;
            LVar7.super_LineCol.col = 0;
            LVar7.super_LineCol.offset = SUB168(ZEXT816(0x7ab1) << 0x40,0);
            LVar7.super_LineCol.line = SUB168(ZEXT816(0x7ab1) << 0x40,8);
            LVar7.name.str =
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            LVar7.name.len = 0x65;
            (*(this->m_stack).m_callbacks.m_error)
                      ((char *)&local_1d8,0x2c,LVar7,(this->m_stack).m_callbacks.m_user_data);
            pSVar18 = this->m_state;
            uVar17 = (this->m_buf).len;
          }
          uVar23 = (pSVar18->pos).super_LineCol.offset + uVar24;
          if (uVar17 <= uVar23) {
            if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
              pcVar2 = (code *)swi(3);
              cVar28 = (csubstr)(*pcVar2)();
              return cVar28;
            }
            handle_error(0x1fa937,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x14c3,"i >= 0 && i < len");
          }
          if ((this->m_buf).str[uVar23] != '\"') {
            builtin_strncpy(local_1c8,"_buf[m_state->pos.offset + pos] == \'\"\')",0x28);
            local_1d8.len._0_1_ = 'i';
            local_1d8.len._1_1_ = 'l';
            local_1d8.len._2_1_ = 'e';
            local_1d8.len._3_1_ = 'd';
            local_1d8.len._4_1_ = ':';
            local_1d8.len._5_1_ = ' ';
            local_1d8.len._6_1_ = '(';
            local_1d8.len._7_1_ = 'm';
            local_1d8.str = (char *)0x6166206b63656863;
            if ((((byte)s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
              pcVar2 = (code *)swi(3);
              cVar28 = (csubstr)(*pcVar2)();
              return cVar28;
            }
            local_f0 = 0;
            uStack_e8 = 0x7ab2;
            local_e0 = 0;
            pcStack_d8 = 
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            local_d0 = 0x65;
            LVar8.super_LineCol.col = 0;
            LVar8.super_LineCol.offset = SUB168(ZEXT816(0x7ab2) << 0x40,0);
            LVar8.super_LineCol.line = SUB168(ZEXT816(0x7ab2) << 0x40,8);
            LVar8.name.str =
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            LVar8.name.len = 0x65;
            (*(this->m_stack).m_callbacks.m_error)
                      ((char *)&local_1d8,0x38,LVar8,(this->m_stack).m_callbacks.m_user_data);
          }
          _line_progressed(this,uVar24 + 1);
          lVar26 = ~sVar21 + (this->m_state->pos).super_LineCol.offset;
          if (lVar26 == 0) {
            local_1d8.len._0_1_ = 'i';
            local_1d8.len._1_1_ = 'l';
            local_1d8.len._2_1_ = 'e';
            local_1d8.len._3_1_ = 'd';
            local_1d8.len._4_1_ = ':';
            local_1d8.len._5_1_ = ' ';
            local_1d8.len._6_1_ = '(';
            local_1d8.len._7_1_ = 'p';
            local_1d8.str = (char *)0x6166206b63656863;
            builtin_strncpy(local_1c8,"os > 0)",8);
            if ((((byte)s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
              pcVar2 = (code *)swi(3);
              cVar28 = (csubstr)(*pcVar2)();
              return cVar28;
            }
            local_118 = 0;
            uStack_110 = 0x7ac2;
            local_108 = 0;
            pcStack_100 = 
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            local_f8 = 0x65;
            LVar9.super_LineCol.col = 0;
            LVar9.super_LineCol.offset = SUB168(ZEXT816(0x7ac2) << 0x40,0);
            LVar9.super_LineCol.line = SUB168(ZEXT816(0x7ac2) << 0x40,8);
            LVar9.name.str =
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            LVar9.name.len = 0x65;
            (*(this->m_stack).m_callbacks.m_error)
                      ((char *)&local_1d8,0x18,LVar9,(this->m_stack).m_callbacks.m_user_data);
          }
          else if (lVar26 == -1) break;
          pcVar20 = (this->m_buf).str;
          sVar21 = (this->m_buf).len;
          if ((local_1e8.str + local_1e8.len != pcVar20 + sVar21) &&
             (local_1e8.str[local_1e8.len] != '\"')) {
            builtin_strncpy(local_1c8 + 0x20,") == \'\"\')",10);
            builtin_strncpy(local_1c8,".end() == m_buf.end() || *s.end(",0x20);
            local_1d8.len._0_1_ = 'i';
            local_1d8.len._1_1_ = 'l';
            local_1d8.len._2_1_ = 'e';
            local_1d8.len._3_1_ = 'd';
            local_1d8.len._4_1_ = ':';
            local_1d8.len._5_1_ = ' ';
            local_1d8.len._6_1_ = '(';
            local_1d8.len._7_1_ = 's';
            local_1d8.str = (char *)0x6166206b63656863;
            if ((((byte)s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
              pcVar2 = (code *)swi(3);
              cVar28 = (csubstr)(*pcVar2)();
              return cVar28;
            }
            local_140 = 0;
            uStack_138 = 0x7ac3;
            local_130 = 0;
            pcStack_128 = 
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            local_120 = 0x65;
            LVar10.super_LineCol.col = 0;
            LVar10.super_LineCol.offset = SUB168(ZEXT816(0x7ac3) << 0x40,0);
            LVar10.super_LineCol.line = SUB168(ZEXT816(0x7ac3) << 0x40,8);
            LVar10.name.str =
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            LVar10.name.len = 0x65;
            (*(this->m_stack).m_callbacks.m_error)
                      ((char *)&local_1d8,0x3a,LVar10,(this->m_stack).m_callbacks.m_user_data);
            pcVar20 = (this->m_buf).str;
            sVar21 = (this->m_buf).len;
          }
          if ((local_1e8.str + local_1e8.len < pcVar20) ||
             (uVar17 = local_1e8.len, pcVar20 + sVar21 < local_1e8.str + local_1e8.len)) {
            pcVar20 = "check failed: (s.end() >= m_buf.begin() && s.end() <= m_buf.end())";
            pbVar22 = &local_1d8;
            for (lVar19 = 8; lVar19 != 0; lVar19 = lVar19 + -1) {
              pbVar22->str = *(char **)pcVar20;
              pcVar20 = pcVar20 + ((ulong)bVar27 * -2 + 1) * 8;
              pbVar22 = (basic_substring<char> *)&pbVar22[-(ulong)bVar27].len;
            }
            uVar13 = (uint)local_198 >> 0x10;
            local_198 = CONCAT22((ushort)uVar13 & 0xff00,0x2929);
            if ((((byte)s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
              pcVar2 = (code *)swi(3);
              cVar28 = (csubstr)(*pcVar2)();
              return cVar28;
            }
            local_168 = 0;
            uStack_160 = 0x7ac4;
            local_158 = 0;
            pcStack_150 = 
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            local_148 = 0x65;
            LVar11.super_LineCol.col = 0;
            LVar11.super_LineCol.offset = SUB168(ZEXT816(0x7ac4) << 0x40,0);
            LVar11.super_LineCol.line = SUB168(ZEXT816(0x7ac4) << 0x40,8);
            LVar11.name.str =
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            LVar11.name.len = 0x65;
            (*(this->m_stack).m_callbacks.m_error)
                      ((char *)&local_1d8,0x43,LVar11,(this->m_stack).m_callbacks.m_user_data);
            uVar17 = local_1e8.len;
          }
          uVar23 = lVar26 - 1;
          if ((lVar26 != 0) && (uVar17 < uVar23)) {
            if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
              pcVar2 = (code *)swi(3);
              cVar28 = (csubstr)(*pcVar2)();
              return cVar28;
            }
            handle_error(0x1fa937,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x153b,"(num >= 0 && num <= len) || (num == npos)");
          }
          uVar25 = uVar23;
          if (lVar26 == 0) {
            uVar25 = uVar17;
          }
          if ((uVar23 != 0) && (uVar17 < uVar25)) {
            if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
              pcVar2 = (code *)swi(3);
              cVar28 = (csubstr)(*pcVar2)();
              return cVar28;
            }
            handle_error(0x1fa937,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x153d,"(first >= 0 && first + rnum <= len) || (num == 0)");
          }
          basic_substring<char>::basic_substring(&local_1d8,local_1e8.str,uVar25);
          local_1e8 = local_1d8;
          goto LAB_001dd7af;
        }
      }
      _line_progressed(this,uVar25);
      uVar23 = uVar23 + 1;
      _line_ended(this);
      _scan_line(this);
      pSVar18 = this->m_state;
      uVar17 = (this->m_buf).len;
    } while ((pSVar18->pos).super_LineCol.offset < uVar17);
  }
  else {
    bVar14 = false;
  }
  bVar16 = is_debugger_attached();
  if ((bVar16) && (bVar16 = is_debugger_attached(), bVar16)) {
    pcVar2 = (code *)swi(3);
    cVar28 = (csubstr)(*pcVar2)();
    return cVar28;
  }
  cVar28.len = 0x34;
  cVar28.str = "ERROR: reached end of file looking for closing quote";
  _err<>(this,cVar28);
LAB_001dd7af:
  cVar28 = (csubstr)local_1e8;
  if (bVar14) {
    cVar28 = _filter_dquot_scalar(this,local_1e8);
    if (((local_1e8.len < cVar28.len) && (local_1e8.len != 0)) && (local_1e8.str != (char *)0x0)) {
      local_1d8 = basic_substring<char>::triml(&local_1e8,' ');
      bVar29 = basic_substring<char>::trimr(&local_1d8,' ');
      if (bVar29.str != (char *)0x0 && bVar29.len != 0) {
        pcVar20 = "check failed: (ret.len <= s.len || s.empty() || s.trim(\' \').empty())";
        pbVar22 = &local_1d8;
        for (lVar26 = 8; lVar26 != 0; lVar26 = lVar26 + -1) {
          pbVar22->str = *(char **)pcVar20;
          pcVar20 = pcVar20 + ((ulong)bVar27 * -2 + 1) * 8;
          pbVar22 = (basic_substring<char> *)&pbVar22[-(ulong)bVar27].len;
        }
        local_194 = 0;
        local_198 = 0x29292879;
        if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
          pcVar2 = (code *)swi(3);
          cVar28 = (csubstr)(*pcVar2)();
          return cVar28;
        }
        local_190 = 0;
        uStack_188 = 0x7acc;
        local_180 = 0;
        pcStack_178 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_170 = 0x65;
        LVar6.super_LineCol.col = 0;
        LVar6.super_LineCol.offset = SUB168(ZEXT816(0x7acc) << 0x40,0);
        LVar6.super_LineCol.line = SUB168(ZEXT816(0x7acc) << 0x40,8);
        LVar6.name.str =
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        LVar6.name.len = 0x65;
        (*(this->m_stack).m_callbacks.m_error)
                  ((char *)&local_1d8,0x45,LVar6,(this->m_stack).m_callbacks.m_user_data);
      }
    }
  }
  return cVar28;
}

Assistant:

csubstr Parser::_scan_dquot_scalar()
{
    // quoted scalars can spread over multiple lines!
    // nice explanation here: http://yaml-multiline.info/

    // a span to the end of the file
    size_t b = m_state->pos.offset;
    substr s = m_buf.sub(b);
    if(s.begins_with(' '))
    {
        s = s.triml(' ');
        _RYML_CB_ASSERT(m_stack.m_callbacks, m_buf.sub(b).is_super(s));
        _RYML_CB_ASSERT(m_stack.m_callbacks, s.begin() >= m_buf.sub(b).begin());
        _line_progressed((size_t)(s.begin() - m_buf.sub(b).begin()));
    }
    b = m_state->pos.offset; // take this into account
    _RYML_CB_ASSERT(m_stack.m_callbacks, s.begins_with('"'));

    // skip the opening quote
    _line_progressed(1);
    s = s.sub(1);

    bool needs_filter = false;

    size_t numlines = 1; // we already have one line
    size_t pos = npos; // find the pos of the matching quote
    while( ! _finished_file())
    {
        const csubstr line = m_state->line_contents.rem;
        bool line_is_blank = true;
        _c4dbgpf("scanning double quoted scalar @ line[{}]:  line='{}'", m_state->pos.line, line);
        for(size_t i = 0; i < line.len; ++i)
        {
            const char curr = line.str[i];
            if(curr != ' ')
                line_is_blank = false;
            // every \ is an escape
            if(curr == '\\')
            {
                const char next = i+1 < line.len ? line.str[i+1] : '~';
                needs_filter = true;
                if(next == '"' || next == '\\')
                    ++i;
            }
            else if(curr == '"')
            {
                pos = i;
                break;
            }
        }

        // leading whitespace also needs filtering
        needs_filter = needs_filter
            || (numlines > 1)
            || line_is_blank
            || (_at_line_begin() && line.begins_with(' '));

        if(pos == npos)
        {
            _line_progressed(line.len);
            ++numlines;
        }
        else
        {
            _RYML_CB_ASSERT(m_stack.m_callbacks, pos >= 0 && pos < m_buf.len);
            _RYML_CB_ASSERT(m_stack.m_callbacks, m_buf[m_state->pos.offset + pos] == '"');
            _line_progressed(pos + 1); // progress beyond the quote
            pos = m_state->pos.offset - b - 1; // but we stop before it
            break;
        }

        _line_ended();
        _scan_line();
    }

    if(pos == npos)
    {
        _c4err("reached end of file looking for closing quote");
    }
    else
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks, pos > 0);
        _RYML_CB_ASSERT(m_stack.m_callbacks, s.end() == m_buf.end() || *s.end() == '"');
        _RYML_CB_ASSERT(m_stack.m_callbacks, s.end() >= m_buf.begin() && s.end() <= m_buf.end());
        s = s.sub(0, pos-1);
    }

    if(needs_filter)
    {
        csubstr ret = _filter_dquot_scalar(s);
        _c4dbgpf("final scalar: [{}]\"{}\"", ret.len, ret);
        _RYML_CB_ASSERT(m_stack.m_callbacks, ret.len <= s.len || s.empty() || s.trim(' ').empty());
        return ret;
    }

    _c4dbgpf("final scalar: \"{}\"", s);

    return s;
}